

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tct3.cpp
# Opt level: O1

void __thiscall CTPNCodeBody::gen_code(CTPNCodeBody *this,int param_1,int param_2)

{
  ushort uVar1;
  CTcTokFileDesc *file;
  CTcPrsSymtab *pCVar2;
  CTcSymLocal *lcl;
  CTcPrsNode *pCVar3;
  ulong protected_start_ofs;
  ulong uVar4;
  CTPNStm *pCVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  undefined4 extraout_var;
  CTcCodeLabel *lbl;
  CTPNCodeBody *pCVar9;
  uchar opc;
  uint uVar10;
  CTcCodeStream **ppCVar11;
  code *fixup_list_head;
  size_t __n;
  CTcGenTarg *pCVar12;
  CTcCodeBodyCtx *pCVar13;
  long lVar14;
  bool bVar15;
  defval_ctx dctx;
  tct3_method_gen_ctx gen_ctx;
  
  uVar1 = *(ushort *)&(this->super_CTPNCodeBodyBase).field_0xb8;
  if ((uVar1 & 4) == 0) {
    if ((this->field_0xd4 & 4) == 0) {
      ppCVar11 = &G_cs_main;
    }
    else {
      ppCVar11 = &G_cs_static;
    }
    fixup_list_head = (code *)(this->super_CTPNCodeBodyBase).fixup_list_anchor_;
    CTcGenTarg::open_method
              (G_cg,*ppCVar11,(CTcSymbol *)(this->super_CTPNCodeBodyBase).fixup_owner_sym_,
               (CTcAbsFixup **)fixup_list_head,this,(this->super_CTPNCodeBodyBase).gototab_,
               (this->super_CTPNCodeBodyBase).argc_,(this->super_CTPNCodeBodyBase).opt_argc_,
               uVar1 >> 1 & 1,(byte)this->field_0xd4 & 1,uVar1 >> 9 & 1,uVar1 >> 6 & 1,&gen_ctx);
    file = (this->super_CTPNCodeBodyBase).start_desc_;
    if (file != (CTcTokFileDesc *)0x0) {
      CTcCodeStream::add_line_rec(G_cs,file,(this->super_CTPNCodeBodyBase).start_linenum_);
    }
    pCVar2 = (this->super_CTPNCodeBodyBase).lcltab_;
    if (pCVar2 != (CTcPrsSymtab *)0x0) {
      for (pCVar2 = pCVar2->parent_; pCVar2 != (CTcPrsSymtab *)0x0; pCVar2 = pCVar2->parent_) {
        CTcCodeStream::set_local_frame(G_cs,pCVar2);
      }
    }
    CTcCodeStream::set_local_frame(G_cs,(this->super_CTPNCodeBodyBase).lcltab_);
    iVar8 = (int)&dctx;
    if (((this->super_CTPNCodeBodyBase).field_0xb8 & 8) != 0) {
      CTPNConst::s_gen_code_int((long)(this->super_CTPNCodeBodyBase).local_ctx_arr_size_);
      CTcGenTarg::write_op(G_cg,0x88);
      CTcGenTarg::write_op(G_cg,0xc0);
      dctx.v = (CTcSymLocal **)CONCAT71(dctx.v._1_7_,2);
      CTcDataStream::write(&G_cs->super_CTcDataStream,iVar8,(void *)0x1,(size_t)fixup_list_head);
      dctx.v = (CTcSymLocal **)CONCAT71(dctx.v._1_7_,(char)G_cg->predef_meta_idx_[4]);
      CTcDataStream::write(&G_cs->super_CTcDataStream,iVar8,(void *)0x1,(size_t)fixup_list_head);
      CTcGenTarg::write_op(G_cg,0x8b);
      pCVar12 = G_cg;
      iVar6 = G_cg->sp_depth_;
      uVar10 = iVar6 + 1;
      fixup_list_head = (code *)(ulong)uVar10;
      G_cg->sp_depth_ = uVar10;
      if (pCVar12->max_sp_depth_ <= iVar6) {
        pCVar12->max_sp_depth_ = uVar10;
      }
      pCVar12->sp_depth_ = pCVar12->sp_depth_ + -1;
      CTcSymLocal::s_gen_code_setlcl_stk((this->super_CTPNCodeBodyBase).local_ctx_var_,0);
      pCVar2 = (this->super_CTPNCodeBodyBase).lcltab_;
      if (pCVar2 != (CTcPrsSymtab *)0x0) {
        CTcPrsSymtab::enum_entries(pCVar2,enum_for_param_ctx,this);
      }
    }
    if (((this->super_CTPNCodeBodyBase).field_0xb8 & 1) != 0) {
      CTcGenTarg::write_op(G_cg,'\r');
      dctx.v = (CTcSymLocal **)CONCAT71(dctx.v._1_7_,(char)(this->super_CTPNCodeBodyBase).argc_);
      CTcDataStream::write(&G_cs->super_CTcDataStream,iVar8,(void *)0x1,(size_t)fixup_list_head);
      pCVar12 = G_cg;
      iVar6 = G_cg->sp_depth_;
      uVar10 = iVar6 + 1;
      fixup_list_head = (code *)(ulong)uVar10;
      G_cg->sp_depth_ = uVar10;
      if (pCVar12->max_sp_depth_ <= iVar6) {
        pCVar12->max_sp_depth_ = uVar10;
      }
      CTcSymLocal::gen_code_setlcl((this->super_CTPNCodeBodyBase).varargs_list_local_);
    }
    pCVar2 = (this->super_CTPNCodeBodyBase).lcltab_;
    if (pCVar2 != (CTcPrsSymtab *)0x0) {
      dctx.nvalo = 0x80;
      dctx.nv = 0;
      dctx.v = (CTcSymLocal **)operator_new__(0x400);
      CTcPrsSymtab::enum_entries(pCVar2,enum_for_named_params,&dctx);
      fixup_list_head = defval_ctx::compare;
      qsort(dctx.v,(long)dctx.nv,8,defval_ctx::compare);
      if (0 < dctx.nv) {
        lVar14 = 0;
        do {
          lcl = dctx.v[lVar14];
          if (((lcl->super_CTcSymLocalBase).field_0x64 & 2) == 0) {
            defval_ctx::gen_opt_positional(lcl);
          }
          else {
            iVar6 = (*(((lcl->super_CTcSymLocalBase).defval_expr_)->super_CTcPrsNodeBase).
                      _vptr_CTcPrsNodeBase[1])();
            if (CONCAT44(extraout_var,iVar6) == 0) {
              protected_start_ofs = (G_cs->super_CTcDataStream).ofs_;
              CTPNConst::s_gen_code_str_by_mode((CTcSymbol *)lcl);
              call_internal_bif("t3GetNamedArg",0x2d29,1);
              uVar4 = (G_cs->super_CTcDataStream).ofs_;
              lbl = CTcPrsNode::gen_jump_ahead(0x91);
              pCVar12 = G_cg;
              G_cg->sp_depth_ = G_cg->sp_depth_ + -1;
              CTcT3ExcTable::add_catch
                        (&pCVar12->exc_table_,protected_start_ofs,uVar4 - 1,0,
                         (G_cs->super_CTcDataStream).ofs_);
              pCVar12 = G_cg;
              iVar6 = G_cg->sp_depth_;
              iVar7 = iVar6 + 1;
              G_cg->sp_depth_ = iVar7;
              if (pCVar12->max_sp_depth_ <= iVar6) {
                pCVar12->max_sp_depth_ = iVar7;
              }
              CTcGenTarg::write_op(pCVar12,0x89);
              G_cg->sp_depth_ = G_cg->sp_depth_ + -1;
              pCVar3 = (lcl->super_CTcSymLocalBase).defval_expr_;
              (**(pCVar3->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase)(pCVar3,0,0);
              CTcPrsNode::def_label_pos(lbl);
            }
            else {
              pCVar3 = (lcl->super_CTcSymLocalBase).defval_expr_;
              (**(pCVar3->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase)(pCVar3,0,0);
              CTPNConst::s_gen_code_str_by_mode((CTcSymbol *)lcl);
              call_internal_bif("t3GetNamedArg",0x2d29,2);
            }
            fixup_list_head = (code *)0x0;
            (*(lcl->super_CTcSymLocalBase).super_CTcSymbol.super_CTcSymbolBase.super_CVmHashEntryCS.
              super_CVmHashEntry._vptr_CVmHashEntry[0x19])(lcl,1,1,0,"=",0,0,0,0);
          }
          lVar14 = lVar14 + 1;
        } while (lVar14 < dctx.nv);
      }
      if (dctx.v != (CTcSymLocal **)0x0) {
        operator_delete__(dctx.v);
      }
    }
    if (((G_cg->field_0xd0 & 4) != 0) &&
       (uVar1 = *(ushort *)&(this->super_CTPNCodeBodyBase).field_0xb8, uVar10 = ~(uint)uVar1,
       bVar15 = (uVar10 & 0x840) != 0,
       fixup_list_head = (code *)(ulong)CONCAT31((int3)(uVar10 >> 8),bVar15),
       (uVar1 & 0x180) != 0 && !bVar15)) {
      CTcGenTarg::write_op(G_cg,0x8e);
      dctx.v = (CTcSymLocal **)CONCAT71(dctx.v._1_7_,4);
      CTcDataStream::write(&G_cs->super_CTcDataStream,iVar8,(void *)0x1,(size_t)fixup_list_head);
      CTPNConst::s_gen_code_int(1);
      CTcGenTarg::write_op(G_cg,0xba);
      pCVar12 = G_cg;
      uVar10 = G_cg->sp_depth_;
      fixup_list_head = (code *)(ulong)uVar10;
      G_cg->sp_depth_ = uVar10 + 1;
      if (pCVar12->max_sp_depth_ <= (int)uVar10) {
        pCVar12->max_sp_depth_ = uVar10 + 1;
      }
      pCVar12->sp_depth_ = pCVar12->sp_depth_ + -1;
      CTcGenTarg::write_op
                (pCVar12,((*(uint *)&(this->super_CTPNCodeBodyBase).field_0xb8 >> 8 & 1) != 0) +
                         0xeb);
      G_cg->sp_depth_ = G_cg->sp_depth_ + -1;
    }
    pCVar13 = (this->super_CTPNCodeBodyBase).ctx_head_;
    if (pCVar13 != (CTcCodeBodyCtx *)0x0) {
      lVar14 = 2;
      do {
        CTcGenTarg::write_op(G_cg,0x8e);
        dctx.v = (CTcSymLocal **)CONCAT71(dctx.v._1_7_,4);
        CTcDataStream::write(&G_cs->super_CTcDataStream,iVar8,(void *)0x1,(size_t)fixup_list_head);
        CTPNConst::s_gen_code_int(lVar14);
        CTcGenTarg::write_op(G_cg,0xba);
        pCVar12 = G_cg;
        uVar10 = G_cg->sp_depth_;
        fixup_list_head = (code *)(ulong)uVar10;
        G_cg->sp_depth_ = uVar10 + 1;
        if (pCVar12->max_sp_depth_ <= (int)uVar10) {
          pCVar12->max_sp_depth_ = uVar10 + 1;
        }
        pCVar12->sp_depth_ = pCVar12->sp_depth_ + -1;
        if ((pCVar13->level_ == 1) &&
           (uVar1 = *(ushort *)&(this->super_CTPNCodeBodyBase).field_0xb8, uVar10 = uVar1 & 0x440,
           bVar15 = (short)uVar10 != 0x40,
           fixup_list_head = (code *)(ulong)CONCAT31((int3)(uVar10 >> 8),bVar15),
           (uVar1 & 0x180) != 0 && !bVar15)) {
          CTcGenTarg::write_op(pCVar12,0x88);
          pCVar12 = G_cg;
          iVar6 = G_cg->sp_depth_;
          uVar10 = iVar6 + 1;
          fixup_list_head = (code *)(ulong)uVar10;
          G_cg->sp_depth_ = uVar10;
          if (pCVar12->max_sp_depth_ <= iVar6) {
            pCVar12->max_sp_depth_ = uVar10;
          }
          CTPNConst::s_gen_code_int(1);
          CTcGenTarg::write_op(G_cg,0xba);
          pCVar9 = CTPNCodeBodyBase::get_outermost_enclosing(&this->super_CTPNCodeBodyBase);
          if ((pCVar9 == (CTPNCodeBody *)0x0) ||
             (fixup_list_head = (code *)CONCAT71((int7)((ulong)fixup_list_head >> 8),0xec),
             ((pCVar9->super_CTPNCodeBodyBase).field_0xb8 & 0x20) == 0)) {
            fixup_list_head = (code *)CONCAT71((int7)((ulong)fixup_list_head >> 8),0xeb);
          }
          CTcGenTarg::write_op(G_cg,(uchar)fixup_list_head);
          G_cg->sp_depth_ = G_cg->sp_depth_ + -2;
        }
        CTcSymLocal::s_gen_code_setlcl_stk(pCVar13->var_num_,0);
        pCVar13 = pCVar13->nxt_;
        lVar14 = lVar14 + 1;
      } while (pCVar13 != (CTcCodeBodyCtx *)0x0);
    }
    uVar1 = *(ushort *)&(this->super_CTPNCodeBodyBase).field_0xb8;
    if ((uVar1 & 0x30) != 0 && (~uVar1 & 0x48) == 0) {
      pCVar9 = CTPNCodeBodyBase::get_outermost_enclosing(&this->super_CTPNCodeBodyBase);
      opc = 0xed;
      if ((((this->super_CTPNCodeBodyBase).field_0xb8 & 0x20) == 0) &&
         ((pCVar9 == (CTPNCodeBody *)0x0 ||
          (((pCVar9->super_CTPNCodeBodyBase).field_0xb8 & 0x20) == 0)))) {
        opc = 0x84;
      }
      CTcGenTarg::write_op(G_cg,opc);
      pCVar12 = G_cg;
      uVar10 = G_cg->sp_depth_;
      __n = (size_t)uVar10;
      G_cg->sp_depth_ = uVar10 + 1;
      if (pCVar12->max_sp_depth_ <= (int)uVar10) {
        pCVar12->max_sp_depth_ = uVar10 + 1;
      }
      iVar6 = (this->super_CTPNCodeBodyBase).local_ctx_var_;
      if (iVar6 < 0x100) {
        CTcGenTarg::write_op(pCVar12,0xef);
        dctx.v = (CTcSymLocal **)
                 CONCAT71(dctx.v._1_7_,(char)(this->super_CTPNCodeBodyBase).local_ctx_var_);
        CTcDataStream::write(&G_cs->super_CTcDataStream,iVar8,(void *)0x1,__n);
        dctx.v = (CTcSymLocal **)CONCAT71(dctx.v._1_7_,1);
        CTcDataStream::write(&G_cs->super_CTcDataStream,iVar8,(void *)0x1,__n);
        iVar8 = -1;
      }
      else {
        CTcSymLocal::s_gen_code_getlcl(iVar6,0);
        CTPNConst::s_gen_code_int(1);
        CTcGenTarg::write_op(G_cg,0xe4);
        CTcGenTarg::write_op(G_cg,0x89);
        iVar8 = -3;
      }
      G_cg->sp_depth_ = G_cg->sp_depth_ + iVar8;
    }
    pCVar5 = (this->super_CTPNCodeBodyBase).stm_;
    if (pCVar5 != (CTPNStm *)0x0) {
      (**(pCVar5->super_CTPNStmBase).super_CTcPrsNode.super_CTcPrsNodeBase._vptr_CTcPrsNodeBase)
                (pCVar5,1,1);
    }
    pCVar12 = G_cg;
    CTcGenTarg::close_method
              (G_cg,(this->super_CTPNCodeBodyBase).local_cnt_,(this->super_CTPNCodeBodyBase).lcltab_
               ,(this->super_CTPNCodeBodyBase).end_desc_,(this->super_CTPNCodeBodyBase).end_linenum_
               ,&gen_ctx,this->named_arg_tables_);
    this->first_nested_symtab_ = G_cs->frame_head_;
    if ((G_cg->field_0xd0 & 8) == 0) {
      build_debug_table((CTPNCodeBody *)pCVar12,gen_ctx.method_ofs,G_debug);
    }
    CTPNCodeBodyBase::check_unreferenced_labels(&this->super_CTPNCodeBodyBase);
    if (G_disasm_out != (CTcUnasOut *)0x0) {
      show_disassembly(this,gen_ctx.method_ofs,gen_ctx.code_start_ofs,gen_ctx.code_end_ofs);
    }
    CTcGenTarg::close_method_cleanup(G_cg,&gen_ctx);
  }
  return;
}

Assistant:

void CTPNCodeBody::gen_code(int, int)
{
    /* if I've been replaced, don't bother generating any code */
    if (replaced_)
        return;

    /* 
     *   Open the method header.
     *   
     *   Generate to the static stream if this is a static initializer
     *   method, otherwise to the main stream. 
     *   
     *   Anchor the fixups in the associated symbol table entry, if any.  We
     *   maintain our own fixup list if we don't have a symbol, otherwise we
     *   use the one from our symbol table entry - in either case, we have to
     *   keep track of it ourselves, because a code body might be reachable
     *   through multiple references (a function, for example, has a global
     *   symbol table entry - fixups referencing us might already have been
     *   created by the time we generate our code).  
     */
    tct3_method_gen_ctx gen_ctx;
    G_cg->open_method(
        is_static_ ? G_cs_static : G_cs_main,
        fixup_owner_sym_, fixup_list_anchor_,
        this, gototab_, argc_, opt_argc_, varargs_,
        is_constructor_, op_overload_, self_valid_, &gen_ctx);

    /* 
     *   Add a line record at the start of the method for all of the
     *   generated method prolog code.  Some prolog code can throw errors, so
     *   we want a line record at the start of the code body to indicate the
     *   location of any such errors. 
     */
    if (start_desc_ != 0)
        G_cs->add_line_rec(start_desc_, start_linenum_);

    /* 
     *   Add each local symbol table enclosing the code body's primary
     *   local symbol table to the frame list.  The outermost code body
     *   table can be outside the primary code body table for situations
     *   such as anonymous functions.  Since these tables are outside of
     *   any statements, we must explicitly add them to ensure that they
     *   are assigned debugging frame ID's and are written to the debug
     *   data.
     */
    if (lcltab_ != 0)
    {
        /* add each frame outside the primary frame to the code gen list */
        for (CTcPrsSymtab *tab = lcltab_->get_parent() ; tab != 0 ;
             tab = tab->get_parent())
            G_cs->set_local_frame(tab);
    }

    /* the method's local symbol table is now the active symbol table */
    G_cs->set_local_frame(lcltab_);

    /* if we have a local context, initialize it */
    if (has_local_ctx_)
    {
        /* write code to create the new Vector to store the context locals */
        CTPNConst::s_gen_code_int(local_ctx_arr_size_);
        G_cg->write_op(OPC_DUP);
        G_cg->write_op(OPC_NEW1);
        G_cs->write(2);
        G_cs->write((char)G_cg->get_predef_meta_idx(TCT3_METAID_VECTOR));

        /* retrieve the object value */
        G_cg->write_op(OPC_GETR0);

        /*
         *   we duplicated the vector size argument, then we popped it and
         *   pushed the object; so we have a maximum of one extra push and a
         *   net of zero 
         */
        G_cg->note_push();
        G_cg->note_pop();

        /* store the new object in the context local variable */
        CTcSymLocal::s_gen_code_setlcl_stk(local_ctx_var_, FALSE);

        /* 
         *   go through our symbol table, and copy each parameter that's
         *   also a context local into its context local slot 
         */
        if (lcltab_ != 0)
            lcltab_->enum_entries(&enum_for_param_ctx, this);
    }

    /* 
     *   If we have a varargs-list parameter, generate the code to set up
     *   the list value from the actual parameters.  Note that we must do
     *   this after we set up the local context, in case the varargs list
     *   parameter variable is a context local, in which case it will need
     *   to be stored in the context, in which case we need the context to
     *   be initialized first.  
     */
    if (varargs_list_)
    {
        /* generate the PUSHPARLST instruction to create the list */
        G_cg->write_op(OPC_PUSHPARLST);
        G_cs->write((uchar)argc_);

        /* 
         *   we pushed at least one value (the list); we don't know how many
         *   others we might have pushed, but it doesn't matter because the
         *   interpreter is responsible for checking for stack space 
         */
        G_cg->note_push();

        /* store the list in our varargs parameter list local */
        varargs_list_local_->gen_code_setlcl();
    }

    /* 
     *   generate other special parameter setup code: named arguments and
     *   default values 
     */
    if (lcltab_ != 0)
    {
        /* 
         *   generate bindings for named parameters and optional positional
         *   parameters that don't have default expressions, and build the
         *   array of optional parameters with default expressions
         */
        defval_ctx dctx;
        lcltab_->enum_entries(&enum_for_named_params, &dctx);

        /* sort the default value list in left-to-right parameter order */
        dctx.sort();

        /* generate the default value assignments */
        for (int i = 0 ; i < dctx.nv ; ++i)
        {
            /* get this local */
            CTcSymLocal *lcl = dctx.v[i];

            /* generate the proper code depending on the parameter type */
            if (lcl->is_named_param())
            {
                /* 
                 *   Named parameter with a default.
                 *   
                 *   If the default is a constant, call t3GetNamedArg(name,
                 *   defVal).  This returns the argument value, or the
                 *   default value if the argument isn't defined.
                 *   
                 *   If the default value expression isn't a constant, we
                 *   can't evaluate it until we know whether or not the
                 *   argument is defined, since the expression could have
                 *   side effects that we don't want to trigger unless we
                 *   really need to evaluate the expression.  So in this
                 *   case, we have to look up the argument first, and set the
                 *   default only the argument doesn't exist.
                 *   
                 *   Note that we could handle both cases with the
                 *   non-constant handling, since it would make no difference
                 *   semantically to defer evaluating a constant until after
                 *   checking to see if the argument exists.  However, the
                 *   separate version for constants yields faster and smaller
                 *   byte code, so we use it as an optimization for a common
                 *   case.  
                 */
                if (lcl->get_defval_expr()->is_const())
                {
                    /* constant default - use t3GetNamedArg(name, defval) */
                    lcl->get_defval_expr()->gen_code(FALSE, FALSE);
                    CTPNConst::s_gen_code_str_by_mode(lcl);
                    call_internal_bif("t3GetNamedArg",
                                      TCERR_NAMED_PARAM_MISSING_FUNC, 2);
                }
                else
                {
                    /* 
                     *   Non-constant default value.  We don't want to
                     *   evaluate the argument unless necessary in this case,
                     *   so start by calling t3GetNamedArg(name).  This will
                     *   throw an error if the argument doesn't exist, so do
                     *   this in an implied try/catch block.  If we return
                     *   without an error, simply proceed with the value
                     *   returned.  If an error is thrown, catch the error
                     *   and *then* evaluate the default value.  
                     */
                    ulong start_ofs = G_cs->get_ofs();
                    CTPNConst::s_gen_code_str_by_mode(lcl);
                    call_internal_bif("t3GetNamedArg",
                                      TCERR_NAMED_PARAM_MISSING_FUNC, 1);

                    /* that's the end of the implied 'try' section */
                    ulong end_ofs = G_cs->get_ofs() - 1;

                    /* 
                     *   On a successful return, the result value will be at
                     *   top of stack, so just jump past the evaluation of
                     *   the default value.  Since we're done with this
                     *   branch, clear what it left on the stack, since the
                     *   'catch' branch will leave the same thing on the
                     *   stack in parallel.  
                     */
                    CTcCodeLabel *asi_lbl = gen_jump_ahead(OPC_JMP);
                    G_cg->note_pop();

                    /* this is the start of our implied 'catch' block */
                    G_cg->get_exc_table()->add_catch(
                        start_ofs, end_ofs, VM_INVALID_OBJ, G_cs->get_ofs());
                    G_cg->note_push();

                    /* discard the exception */
                    G_cg->write_op(OPC_DISC);
                    G_cg->note_pop();

                    /* generate the default value expression */
                    lcl->get_defval_expr()->gen_code(FALSE, FALSE);

                    /* this is the common 'assign' branch point */
                    def_label_pos(asi_lbl);
                }

                /* assign the top-of-stack value to the local */
                lcl->gen_code_asi(TRUE, 1, TC_ASI_SIMPLE, "=", 0, 
                                  FALSE, FALSE, 0);
            }
            else
            {
                /* it's a positional parameter - generate it */
                dctx.gen_opt_positional(lcl);
            }
        }
    }

    /*
     *   If this is a dynamic function (a DynamicFunc object), and it's
     *   defined with the 'function' keyword (not 'method'), and it has a
     *   'self', we need to set up the method context to point to the
     *   enclosing frame object's method context.  
     */
    if (G_cg->is_eval_for_dyn()
        && is_dyn_func_
        && self_valid_
        && (self_referenced_ || full_method_ctx_referenced_))
    {
        /*
         *   We need the method context.  For dyanmic code, the invokee is
         *   the DynamicFunc, and the DynamicFunc makes the context available
         *   via its indexed value [1].  
         */
        G_cg->write_op(OPC_PUSHCTXELE);
        G_cs->write(PUSHCTXELE_INVOKEE);
        CTPNConst::s_gen_code_int(1);
        G_cg->write_op(OPC_INDEX);

        /* we pushed the invokee and popped it again with the INDEX */
        G_cg->note_push();
        G_cg->note_pop();

        /* 
         *   The invokee will store the appropriate object in its [1]
         *   element, according to which type of method context we need.
         *   Generate the appropriate 'set' for it.  
         */
        if (full_method_ctx_referenced_)
        {
            /* load the full method context */
            G_cg->write_op(OPC_LOADCTX);
        }
        else
        {
            /* load the 'self' object */
            G_cg->write_op(OPC_SETSELF);
        }

        /* that pops the context object */
        G_cg->note_pop();
    }

    /* 
     *   Generate code to initialize each enclosing-context-pointer local -
     *   these variables allow us to find the context objects while we're
     *   running inside this function.
     *   
     *   Before 3.1, we had to generate context level 1 last, because this
     *   level sets 'self' for an anonymous function to the saved 'self' from
     *   the context.  Starting with 3.1, the stack frame has a separate
     *   entry for the invokee, so we no longer conflate the anonymous
     *   function object with 'self'.  
     */
    CTcCodeBodyCtx *cur_ctx;
    int ctx_idx;
    for (ctx_idx = 0, cur_ctx = ctx_head_ ; cur_ctx != 0 ;
         cur_ctx = cur_ctx->nxt_, ++ctx_idx)
    {
        /* 
         *   Get this context value, stored in invokee[n+2].  Note that the
         *   context object indices start at 2 because the FUNCPTR value for
         *   the code itself is at index 1.  
         */
        G_cg->write_op(OPC_PUSHCTXELE);
        G_cs->write(PUSHCTXELE_INVOKEE);
        CTPNConst::s_gen_code_int(ctx_idx + 2);
        G_cg->write_op(OPC_INDEX);

        /* 
         *   we pushed the object, then popped the object and index and
         *   pushed the indexed value - this is a net of no change with one
         *   maximum push 
         */
        G_cg->note_push();
        G_cg->note_pop();

        /*
         *   If this is context level 1, and this context has a 'self', and
         *   we need either 'self' or the full method context from the
         *   lexically enclosing scope, generate code to load the self or the
         *   full method context (as appropriate) from our local context.
         *   
         *   The enclosing method context is always stored in the context at
         *   level 1, because this is inherently shared context for all
         *   enclosed lexical scopes.  We thus only have to worry about this
         *   for context level 1.  
         */
        if (cur_ctx->level_ == 1
            && !is_anon_method_
            && self_valid_
            && (self_referenced_ || full_method_ctx_referenced_))
        {
            CTPNCodeBody *outer;
            
            /* 
             *   we just put our context object on the stack in preparation
             *   for storing it - make a duplicate copy of it for our own
             *   purposes 
             */
            G_cg->write_op(OPC_DUP);
            G_cg->note_push();
            
            /* get the saved method context from the context object */
            CTPNConst::s_gen_code_int(TCPRS_LOCAL_CTX_METHODCTX);
            G_cg->write_op(OPC_INDEX);
                
            /* 
             *   Load the context.  We must check the outermost context to
             *   determine what it stored, because we must load whatever it
             *   stored.  
             */
            if ((outer = get_outermost_enclosing()) != 0
                && outer->local_ctx_needs_full_method_ctx())
            {
                /* load the full method context */
                G_cg->write_op(OPC_LOADCTX);
            }
            else
            {
                /* load the 'self' object */
                G_cg->write_op(OPC_SETSELF);
            }
            
            /* 
             *   we popped two values and pushed one in the INDEX, then
             *   popped a value in the LOADCTX or SETSELF: the net is removal
             *   of two elements and no additional maximum depth 
             */
            G_cg->note_pop(2);
        }

        /* store the context value in the appropriate local variable */
        CTcSymLocal::s_gen_code_setlcl_stk(cur_ctx->var_num_, FALSE);
    }

    /* 
     *   if we created our own local context, and we have a 'self' object,
     *   and we need access to the 'self' object or the full method context
     *   from anonymous functions that refer to the local context, generate
     *   code to store the appropriate data in the local context 
     */
    if (has_local_ctx_ && self_valid_
        && (local_ctx_needs_self_ || local_ctx_needs_full_method_ctx_))
    {
        /* 
         *   Check to see what we need.  If we're marked as needing the full
         *   method context, OR our outermost enclosing context has the full
         *   context, we need to generate the full context.  Intermediate
         *   nesting levels of anonymous functions can need less context than
         *   inner levels, but the context we actually generate at the outer
         *   level depends on the innermost function's needs.  So we simply
         *   need to follow the lead of the outermost level, since that's
         *   what the inner levels will all do.  
         */
        CTPNCodeBody *outer = get_outermost_enclosing();
        if (local_ctx_needs_full_method_ctx_
            || (outer != 0 && outer->local_ctx_needs_full_method_ctx()))
        {
            /* 
             *   we need the full method context - generate code to store it
             *   and push a reference to it onto the stack 
             */
            G_cg->write_op(OPC_STORECTX);
        }
        else
        {
            /* we only need 'self' - push it */
            G_cg->write_op(OPC_PUSHSELF);
        }

        /* we just pushed one value */
        G_cg->note_push();

        /* assign the value to the context variable */
        if (local_ctx_var_ <= 255 && TCPRS_LOCAL_CTX_METHODCTX <= 255)
        {
            /* we can make the assignment with a single instruction */
            G_cg->write_op(OPC_SETINDLCL1I8);
            G_cs->write((uchar)local_ctx_var_);
            G_cs->write(TCPRS_LOCAL_CTX_METHODCTX);

            /* that pops one value */
            G_cg->note_pop();
        }
        else
        {
            /* get the context object */
            CTcSymLocal::s_gen_code_getlcl(local_ctx_var_, FALSE);
            
            /* store the data in the local context object */
            CTPNConst::s_gen_code_int(TCPRS_LOCAL_CTX_METHODCTX);
            G_cg->write_op(OPC_SETIND);

            /* discard the indexed result */
            G_cg->write_op(OPC_DISC);
        
            /* 
             *   the SETIND pops three values and pushes one, then we pop one
             *   more with the DISC - this is a net three pops with no extra
             *   maximum depth 
             */
            G_cg->note_pop(3);
        }
    }

    /* generate the compound statement, if we have one */
    if (stm_ != 0)
        stm_->gen_code(TRUE, TRUE);

#ifdef T3_DEBUG
    if (G_cg->get_sp_depth() != 0)
    {
        printf("---> stack depth is %d after block codegen (line %ld)!\n",
               G_cg->get_sp_depth(), end_linenum_);
        if (fixup_owner_sym_ != 0)
            printf("---> code block for %.*s\n",
                   (int)fixup_owner_sym_->get_sym_len(),
                   fixup_owner_sym_->get_sym());
    }
#endif

    /* close the method */
    G_cg->close_method(local_cnt_, lcltab_, end_desc_, end_linenum_,
                       &gen_ctx, named_arg_tables_);

    /* remember the head of the nested symbol table list */
    first_nested_symtab_ = G_cs->get_first_frame();

    /* 
     *   Generate debug records.  If we're in debug mode, include the full
     *   symbolic debugging information, including source line locations.
     *   For release builds, include only the local variable symbols and
     *   frame information; we need those even in release builds, for
     *   reflection purposes.
     *   
     *   If we're generating this code for a debugger evaluation, omit
     *   symbols.  We don't need reflection support for debugger expressions,
     *   since there doesn't seem to be any practical reason you'd need it
     *   there.  
     */
    if (!G_cg->is_eval_for_debug())
        build_debug_table(gen_ctx.method_ofs, G_debug);

    /* check for unreferenced labels and issue warnings */
    check_unreferenced_labels();

    /* show the disassembly of the code block if desired */
    if (G_disasm_out != 0)
        show_disassembly(gen_ctx.method_ofs,
                         gen_ctx.code_start_ofs, gen_ctx.code_end_ofs);

    /* clean up globals for the end of the method */
    G_cg->close_method_cleanup(&gen_ctx);
}